

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O3

void __thiscall LinearScan::SpillInlineeArgs(LinearScan *this,Instr *instr)

{
  RealCount *pRVar1;
  RegNum RVar2;
  uint uVar3;
  Lifetime *spilledRange;
  StackSym *sym;
  code *pcVar4;
  bool bVar5;
  uint32 uVar6;
  undefined4 *puVar7;
  Func **ppFVar8;
  Type pSVar9;
  LoweredBasicBlock *pLVar10;
  long lVar11;
  ulong local_40;
  
  pLVar10 = this->currentBlock;
  if ((pLVar10->inlineeStack).super_ReadOnlyList<Func_*,_Memory::JitArenaAllocator,_DefaultComparer>
      .count < 1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                       ,0xd4c,"(this->currentBlock->inlineeStack.Count() > 0)",
                       "this->currentBlock->inlineeStack.Count() > 0");
    if (!bVar5) {
LAB_0058525f:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar7 = 0;
    pLVar10 = this->currentBlock;
  }
  ppFVar8 = JsUtil::
            List<Func_*,_Memory::JitArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
            Last(&pLVar10->inlineeStack);
  instr->m_func = *ppFVar8;
  pLVar10 = this->currentBlock;
  if (0 < (pLVar10->inlineeFrameLifetimes).
          super_ReadOnlyList<Lifetime_*,_Memory::JitArenaAllocator,_DefaultComparer>.count) {
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    local_40 = 0;
    lVar11 = 0;
    do {
      spilledRange = (pLVar10->inlineeFrameLifetimes).
                     super_ReadOnlyList<Lifetime_*,_Memory::JitArenaAllocator,_DefaultComparer>.
                     buffer[lVar11];
      uVar3 = spilledRange->start;
      uVar6 = IR::Instr::GetNumber(instr);
      if (uVar3 < uVar6) {
        uVar3 = spilledRange->end;
        uVar6 = IR::Instr::GetNumber(instr);
        if (uVar3 < uVar6) goto LAB_00584fb3;
      }
      else {
LAB_00584fb3:
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar7 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                           ,0xd54,
                           "(lifetime->start < instr->GetNumber() && lifetime->end >= instr->GetNumber())"
                           ,
                           "lifetime->start < instr->GetNumber() && lifetime->end >= instr->GetNumber()"
                          );
        if (!bVar5) goto LAB_0058525f;
        *puVar7 = 0;
      }
      bVar5 = StackSym::IsConst(spilledRange->sym);
      if (bVar5) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar7 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                           ,0xd55,"(!lifetime->sym->IsConst())","!lifetime->sym->IsConst()");
        if (!bVar5) goto LAB_0058525f;
        *puVar7 = 0;
      }
      bVar5 = JsUtil::
              BaseDictionary<unsigned_int,_unsigned_int,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
              ::ContainsKey(&this->currentBlock->inlineeFrameSyms,
                            &(spilledRange->sym->super_Sym).m_id);
      if (!bVar5) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar7 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                           ,0xd56,
                           "(this->currentBlock->inlineeFrameSyms.ContainsKey(lifetime->sym->m_id))"
                           ,"this->currentBlock->inlineeFrameSyms.ContainsKey(lifetime->sym->m_id)")
        ;
        if (!bVar5) goto LAB_0058525f;
        *puVar7 = 0;
      }
      RVar2 = spilledRange->reg;
      if (((RVar2 != RegNOREG) && ((spilledRange->field_0x9c & 0x19) == 0)) &&
         ((sym = spilledRange->sym, (sym->field_0x18 & 1) != 0 ||
          ((SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount> *)
           (spilledRange->defList).super_SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>.
           super_SListNodeBase<Memory::ArenaAllocator>.next != &spilledRange->defList)))) {
        BVUnitT<unsigned_long>::AssertRange((uint)RVar2);
        if ((local_40 >> ((ulong)RVar2 & 0x3f) & 1) == 0) {
          RVar2 = spilledRange->reg;
          BVUnitT<unsigned_long>::AssertRange((uint)RVar2);
          if ((sym->field_0x19 & 0x10) == 0) {
            AllocateStackSpace(this,spilledRange);
          }
          RecordLoopUse(this,spilledRange,spilledRange->reg);
          if (this->regContent[spilledRange->reg] == (Lifetime *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar7 = 1;
            bVar5 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                               ,0xd69,"(this->regContent[lifetime->reg] != nullptr)",
                               "this->regContent[lifetime->reg] != nullptr");
            if (!bVar5) goto LAB_0058525f;
            *puVar7 = 0;
          }
          if ((sym->field_0x18 & 1) != 0) {
            if ((SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount> *)
                (spilledRange->defList).
                super_SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>.
                super_SListNodeBase<Memory::ArenaAllocator>.next != &spilledRange->defList) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar7 = 1;
              bVar5 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                                 ,0xd6e,"(lifetime->defList.Empty())","lifetime->defList.Empty()");
              if (!bVar5) goto LAB_0058525f;
              *puVar7 = 0;
            }
            pSVar9 = (Type)new<Memory::ArenaAllocator>
                                     (0x10,(spilledRange->defList).allocator,0x364470);
            *(anon_union_8_2_fd66ddfd_for_StackSym_35 *)(pSVar9 + 1) = sym->field_5;
            pSVar9->next = (spilledRange->defList).
                           super_SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>.
                           super_SListNodeBase<Memory::ArenaAllocator>.next;
            (spilledRange->defList).super_SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>.
            super_SListNodeBase<Memory::ArenaAllocator>.next = pSVar9;
            pRVar1 = &(spilledRange->defList).
                      super_SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>.
                      super_RealCount;
            pRVar1->count = pRVar1->count + 1;
          }
          local_40 = local_40 | 1L << ((ulong)RVar2 & 0x3f);
          InsertStore(this,instr->m_prev,sym,spilledRange->reg);
        }
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < (pLVar10->inlineeFrameLifetimes).
                      super_ReadOnlyList<Lifetime_*,_Memory::JitArenaAllocator,_DefaultComparer>.
                      count);
  }
  return;
}

Assistant:

void LinearScan::SpillInlineeArgs(IR::Instr* instr)
{
    Assert(this->currentBlock->inlineeStack.Count() > 0);

    // Ensure the call instruction is tied to the current inlinee
    // This is used in the encoder to encode mapping or return offset and InlineeFrameRecord
    instr->m_func = this->currentBlock->inlineeStack.Last();

    BitVector spilledRegs;
    this->currentBlock->inlineeFrameLifetimes.Map([&](uint i, Lifetime* lifetime){
        Assert(lifetime->start < instr->GetNumber() && lifetime->end >= instr->GetNumber());
        Assert(!lifetime->sym->IsConst());
        Assert(this->currentBlock->inlineeFrameSyms.ContainsKey(lifetime->sym->m_id));
        if (lifetime->reg == RegNOREG)
        {
            return;
        }

        StackSym* sym = lifetime->sym;
        if (!lifetime->isSpilled && !lifetime->isOpHelperSpilled &&
            (!lifetime->isDeadStore && (lifetime->sym->m_isSingleDef || !lifetime->defList.Empty()))) // if deflist is empty - we have already spilled at all defs - and the value is current
        {
            if (!spilledRegs.Test(lifetime->reg))
            {
                spilledRegs.Set(lifetime->reg);
                if (!sym->IsAllocated())
                {
                    this->AllocateStackSpace(lifetime);
                }

                this->RecordLoopUse(lifetime, lifetime->reg);
                Assert(this->regContent[lifetime->reg] != nullptr);
                if (sym->m_isSingleDef)
                {
                    // For a single def - we do not track the deflist - the def below will remove the single def on the sym
                    // hence, we need to track the original def.
                    Assert(lifetime->defList.Empty());
                    lifetime->defList.Prepend(sym->m_instrDef);
                }

                this->InsertStore(instr->m_prev, sym, lifetime->reg);
            }
        }
    });
}